

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cascade.h
# Opt level: O0

double __thiscall
Iir::CascadeStages<3,_Iir::DirectFormII>::filter<double>
          (CascadeStages<3,_Iir::DirectFormII> *this,double in)

{
  Biquad *in_RDI;
  double in_XMM0_Qa;
  Biquad *stage;
  Biquad *__end0;
  Biquad *__begin0;
  Biquad (*__range3) [3];
  DirectFormII *state;
  double out;
  Biquad *local_30;
  Biquad *local_20;
  double local_18;
  
  local_20 = in_RDI + 3;
  local_18 = in_XMM0_Qa;
  for (local_30 = in_RDI; local_30 != in_RDI + 3; local_30 = local_30 + 1) {
    local_18 = DirectFormII::filter((DirectFormII *)local_20,local_18,local_30);
    local_20 = (Biquad *)&local_20->m_a2;
  }
  return local_18;
}

Assistant:

inline Sample filter(const Sample in)
        {
                double out = in;
                StateType* state = m_states;
                for (const auto &stage: m_stages)
                        out = (state++)->filter(out, stage);
                return static_cast<Sample> (out);
        }